

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

Instr * __thiscall
IRBuilder::BuildCallI_Helper
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot Src1RegSlot,
          ArgSlot ArgCount,ProfileId profileId,CallFlags flags,InlineCacheIndex inlineCacheIndex)

{
  IRKind IVar1;
  OpCode OVar2;
  Func *func;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  ValueType valueType;
  RegOpnd *src1Opnd;
  JitProfilingInstr *this_00;
  undefined4 *puVar7;
  uint uVar8;
  StackSym *symDst;
  RegOpnd *local_40;
  StackSym *local_38;
  
  src1Opnd = BuildSrcOpnd(this,Src1RegSlot,TyVar);
  if (dstRegSlot == 0xffffffff) {
    local_40 = (RegOpnd *)0x0;
    local_38 = (StackSym *)0x0;
  }
  else {
    local_40 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
    local_38 = local_40->m_sym;
  }
  bVar4 = Func::DoSimpleJitDynamicProfile(this->m_func);
  bVar5 = Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode);
  if (bVar5) {
    newOpcode = Js::OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(newOpcode);
    if (profileId == 0xffff || !bVar4) {
LAB_004d2d9c:
      this_00 = (JitProfilingInstr *)IR::Instr::New(newOpcode,this->m_func);
      if ((this_00->super_Instr).m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar4) goto LAB_004d3070;
        *puVar7 = 0;
      }
      func = (this_00->super_Instr).m_func;
      if ((src1Opnd->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar4) {
LAB_004d3070:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      bVar6 = (src1Opnd->super_Opnd).field_0xb;
      if ((bVar6 & 2) != 0) {
        src1Opnd = (RegOpnd *)IR::Opnd::Copy(&src1Opnd->super_Opnd,func);
        bVar6 = (src1Opnd->super_Opnd).field_0xb;
      }
      (src1Opnd->super_Opnd).field_0xb = bVar6 | 2;
      (this_00->super_Instr).m_src1 = &src1Opnd->super_Opnd;
      if (local_40 == (RegOpnd *)0x0) goto LAB_004d2f6f;
      IR::Instr::SetDst((Instr *)this_00,&local_40->super_Opnd);
    }
    else {
LAB_004d2cde:
      this_00 = IR::JitProfilingInstr::New
                          (newOpcode,&local_40->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
      if ((this_00->super_Instr).m_kind == InstrKindJitProfiling) {
        this_00->profileId = profileId;
LAB_004d2d77:
        this_00->field_0x60 = this_00->field_0x60 & 0xfe | bVar5;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
        if (!bVar4) goto LAB_004d3070;
        *puVar7 = 0;
        IVar1 = (this_00->super_Instr).m_kind;
        this_00->profileId = profileId;
        if (IVar1 == InstrKindJitProfiling) goto LAB_004d2d77;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
        if (!bVar4) goto LAB_004d3070;
        *puVar7 = 0;
        IVar1 = (this_00->super_Instr).m_kind;
        this_00->field_0x60 = this_00->field_0x60 & 0xfe | bVar5;
        if (IVar1 != InstrKindJitProfiling) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
          if (!bVar4) goto LAB_004d3070;
          *puVar7 = 0;
        }
      }
      (this_00->field_2).inlineCacheIndex = inlineCacheIndex;
    }
  }
  else {
    if (profileId == 0xffff) goto LAB_004d2d9c;
    if (bVar4) goto LAB_004d2cde;
    this_00 = (JitProfilingInstr *)
              IR::ProfiledInstr::New
                        (newOpcode,&local_40->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    if ((this_00->super_Instr).m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar4) goto LAB_004d3070;
      *puVar7 = 0;
    }
    this_00->profileId = (short)(uint)profileId;
    this_00->arrayProfileId = (short)((uint)profileId >> 0x10);
  }
  if (newOpcode == NewScObject && local_40 != (RegOpnd *)0x0) {
    valueType = ValueType::GetObject(UninitializedObject);
    IR::Opnd::SetValueType(&local_40->super_Opnd,valueType);
  }
LAB_004d2f6f:
  if ((local_38 != (StackSym *)0x0) && ((*(uint *)&local_38->field_0x18 & 1) != 0)) {
    OVar2 = (this_00->super_Instr).m_opcode;
    uVar8 = OVar2 - 0xc4;
    if (((uVar8 < 0xb) && ((0x429U >> (uVar8 & 0x1f) & 1) != 0)) || (OVar2 == NewScObjectSpread)) {
      *(uint *)&local_38->field_0x18 = *(uint *)&local_38->field_0x18 | 6;
    }
  }
  AddInstr(this,&this_00->super_Instr,offset);
  BuildCallCommon(this,&this_00->super_Instr,symDst,ArgCount,flags);
  return &this_00->super_Instr;
}

Assistant:

IR::Instr *
IRBuilder::BuildCallI_Helper(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot Src1RegSlot, Js::ArgSlot ArgCount, Js::ProfileId profileId, Js::CallFlags flags, Js::InlineCacheIndex inlineCacheIndex)
{
    IR::Instr * instr;
    IR::RegOpnd *   dstOpnd;
    IR::RegOpnd *   src1Opnd;
    StackSym *      symDst;

    src1Opnd = this->BuildSrcOpnd(Src1RegSlot);
    if (dstRegSlot == Js::Constants::NoRegister)
    {
        dstOpnd = nullptr;
        symDst = nullptr;
    }
    else
    {
        dstOpnd = this->BuildDstOpnd(dstRegSlot);
        symDst = dstOpnd->m_sym;
    }

    const bool jitProfiling = m_func->DoSimpleJitDynamicProfile();
    bool profiledReturn = false;
    if (Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode))
    {
        profiledReturn = true;
        newOpcode = Js::OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(newOpcode);

        // If we're profiling in the jitted code we want to propagate the profileId
        //   If we're using profile data instead of collecting it, we don't want to
        //   use the profile data from a return type call (this was previously done in IRBuilder::BuildProfiledCallI)
        if (!jitProfiling)
        {
            profileId = Js::Constants::NoProfileId;
        }
    }

    if (profileId != Js::Constants::NoProfileId)
    {
        if (jitProfiling)
        {
            // In SimpleJit we want this call to be a profiled call after being jitted
            instr = IR::JitProfilingInstr::New(newOpcode, dstOpnd, src1Opnd, m_func);
            instr->AsJitProfilingInstr()->profileId = profileId;
            instr->AsJitProfilingInstr()->isProfiledReturnCall = profiledReturn;
            instr->AsJitProfilingInstr()->inlineCacheIndex = inlineCacheIndex;
        }
        else
        {
            instr = IR::ProfiledInstr::New(newOpcode, dstOpnd, src1Opnd, m_func);
            instr->AsProfiledInstr()->u.profileId = profileId;
        }
    }
    else
    {
        instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(src1Opnd);
        if (dstOpnd != nullptr)
        {
            instr->SetDst(dstOpnd);
        }
    }

    if (dstOpnd && newOpcode == Js::OpCode::NewScObject)
    {
        dstOpnd->SetValueType(ValueType::GetObject(ObjectType::UninitializedObject));
    }

    if (symDst && symDst->m_isSingleDef)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::NewScObject:
        case Js::OpCode::NewScObjectSpread:
        case Js::OpCode::NewScObjectLiteral:
        case Js::OpCode::NewScObjArray:
        case Js::OpCode::NewScObjArraySpread:
            symDst->m_isSafeThis = true;
            symDst->m_isNotNumber = true;
            break;
        }
    }

    this->AddInstr(instr, offset);

    this->BuildCallCommon(instr, symDst, ArgCount, flags);

    return instr;
}